

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

void __thiscall
wallet::LegacyScriptPubKeyMan::KeepDestination
          (LegacyScriptPubKeyMan *this,int64_t nIndex,OutputType *type)

{
  map<long,_CKeyID,_std::less<long>,_std::allocator<std::pair<const_long,_CKeyID>_>_> *this_00;
  int iVar1;
  undefined4 extraout_var;
  mapped_type *pmVar3;
  pointer *__ptr;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_long,_CKeyID>_>,_std::_Rb_tree_iterator<std::pair<const_long,_CKeyID>_>_>
  pVar4;
  WalletBatch batch;
  CPubKey pubkey;
  WalletBatch local_88;
  int64_t local_78;
  CPubKey local_69;
  long local_28;
  WalletDatabase *pWVar2;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_78 = nIndex;
  if (*type == BECH32M) {
    __assert_fail("type != OutputType::BECH32M",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x570,
                  "virtual void wallet::LegacyScriptPubKeyMan::KeepDestination(int64_t, const OutputType &)"
                 );
  }
  iVar1 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3])
                    ();
  pWVar2 = (WalletDatabase *)CONCAT44(extraout_var,iVar1);
  (*pWVar2->_vptr_WalletDatabase[0xe])(&local_88,pWVar2,1);
  local_88.m_database = pWVar2;
  WalletBatch::ErasePool(&local_88,local_78);
  local_69.vch[0] = 0xff;
  this_00 = &this->m_index_to_reserved_key;
  pmVar3 = std::map<long,_CKeyID,_std::less<long>,_std::allocator<std::pair<const_long,_CKeyID>_>_>
           ::at(this_00,&local_78);
  iVar1 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x1f])
                    (this,pmVar3,&local_69);
  if ((char)iVar1 != '\0') {
    LearnRelatedScripts(this,&local_69,*type);
    pVar4 = std::
            _Rb_tree<long,_std::pair<const_long,_CKeyID>,_std::_Select1st<std::pair<const_long,_CKeyID>_>,_std::less<long>,_std::allocator<std::pair<const_long,_CKeyID>_>_>
            ::equal_range(&this_00->_M_t,&local_78);
    std::
    _Rb_tree<long,_std::pair<const_long,_CKeyID>,_std::_Select1st<std::pair<const_long,_CKeyID>_>,_std::less<long>,_std::allocator<std::pair<const_long,_CKeyID>_>_>
    ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar4.first._M_node,(_Base_ptr)pVar4.second._M_node);
    ScriptPubKeyMan::WalletLogPrintf<long>((ScriptPubKeyMan *)this,"keypool keep %d\n",local_78);
    if ((_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)
        local_88.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
        (_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)0x0) {
      (*(*(_func_int ***)
          local_88.m_batch._M_t.
          super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
          _M_t.
          super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
          .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("have_pk",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                ,0x576,
                "virtual void wallet::LegacyScriptPubKeyMan::KeepDestination(int64_t, const OutputType &)"
               );
}

Assistant:

void LegacyScriptPubKeyMan::KeepDestination(int64_t nIndex, const OutputType& type)
{
    assert(type != OutputType::BECH32M);
    // Remove from key pool
    WalletBatch batch(m_storage.GetDatabase());
    batch.ErasePool(nIndex);
    CPubKey pubkey;
    bool have_pk = GetPubKey(m_index_to_reserved_key.at(nIndex), pubkey);
    assert(have_pk);
    LearnRelatedScripts(pubkey, type);
    m_index_to_reserved_key.erase(nIndex);
    WalletLogPrintf("keypool keep %d\n", nIndex);
}